

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O1

void __thiscall
flatbuffers::go::GoGenerator::StructPackArgs
          (GoGenerator *this,StructDef *struct_def,char *nameprefix,string *code_ptr)

{
  FieldDef *pFVar1;
  StructDef *struct_def_00;
  char *pcVar2;
  long *plVar3;
  undefined8 *puVar4;
  ulong *puVar5;
  long *plVar6;
  ulong uVar7;
  pointer ppFVar8;
  ulong *local_d8;
  long local_d0;
  ulong local_c8;
  long lStack_c0;
  long *local_b8;
  long local_b0;
  long local_a8;
  long lStack_a0;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  GoGenerator *local_78;
  IdlNamer *local_70;
  string *local_68;
  char *local_60;
  long *local_58 [2];
  long local_48 [2];
  StructDef *local_38;
  
  ppFVar8 = (struct_def->fields).vec.
            super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppFVar8 !=
      (struct_def->fields).vec.
      super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_70 = &this->namer_;
    local_78 = this;
    local_68 = code_ptr;
    local_60 = nameprefix;
    local_38 = struct_def;
    do {
      pFVar1 = *ppFVar8;
      if ((pFVar1->value).type.base_type == BASE_TYPE_STRUCT) {
        struct_def_00 = (pFVar1->value).type.struct_def;
        (*(local_70->super_Namer)._vptr_Namer[0x12])((string *)local_58,local_70,pFVar1);
        pcVar2 = local_60;
        strlen(local_60);
        plVar3 = (long *)std::__cxx11::string::replace((ulong)local_58,0,(char *)0x0,(ulong)pcVar2);
        local_d8 = &local_c8;
        puVar5 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar5) {
          local_c8 = *puVar5;
          lStack_c0 = plVar3[3];
        }
        else {
          local_c8 = *puVar5;
          local_d8 = (ulong *)*plVar3;
        }
        local_d0 = plVar3[1];
        *plVar3 = (long)puVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_d8);
        plVar6 = plVar3 + 2;
        if ((long *)*plVar3 == plVar6) {
          local_a8 = *plVar6;
          lStack_a0 = plVar3[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar6;
          local_b8 = (long *)*plVar3;
        }
        local_b0 = plVar3[1];
        *plVar3 = (long)plVar6;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        StructPackArgs(local_78,struct_def_00,(char *)local_b8,local_68);
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
      }
      else {
        local_58[0] = local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_58,", t.","");
        plVar3 = (long *)std::__cxx11::string::append((char *)local_58);
        puVar5 = (ulong *)(plVar3 + 2);
        if ((ulong *)*plVar3 == puVar5) {
          local_c8 = *puVar5;
          lStack_c0 = plVar3[3];
          local_d8 = &local_c8;
        }
        else {
          local_c8 = *puVar5;
          local_d8 = (ulong *)*plVar3;
        }
        local_d0 = plVar3[1];
        *plVar3 = (long)puVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        (*(local_70->super_Namer)._vptr_Namer[0x12])(&local_98,local_70,pFVar1);
        uVar7 = 0xf;
        if (local_d8 != &local_c8) {
          uVar7 = local_c8;
        }
        if (uVar7 < (ulong)(local_90 + local_d0)) {
          uVar7 = 0xf;
          if (local_98 != local_88) {
            uVar7 = local_88[0];
          }
          if (uVar7 < (ulong)(local_90 + local_d0)) goto LAB_002118e8;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,(ulong)local_d8);
        }
        else {
LAB_002118e8:
          puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_d8,(ulong)local_98);
        }
        plVar3 = puVar4 + 2;
        if ((long *)*puVar4 == plVar3) {
          local_a8 = *plVar3;
          lStack_a0 = puVar4[3];
          local_b8 = &local_a8;
        }
        else {
          local_a8 = *plVar3;
          local_b8 = (long *)*puVar4;
        }
        local_b0 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)plVar3 = 0;
        std::__cxx11::string::_M_append((char *)local_68,(ulong)local_b8);
        if (local_b8 != &local_a8) {
          operator_delete(local_b8,local_a8 + 1);
        }
        if (local_98 != local_88) {
          operator_delete(local_98,local_88[0] + 1);
        }
      }
      if (local_d8 != &local_c8) {
        operator_delete(local_d8,local_c8 + 1);
      }
      if (local_58[0] != local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      ppFVar8 = ppFVar8 + 1;
    } while (ppFVar8 !=
             (local_38->fields).vec.
             super__Vector_base<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void StructPackArgs(const StructDef &struct_def, const char *nameprefix,
                      std::string *code_ptr) {
    std::string &code = *code_ptr;
    for (auto it = struct_def.fields.vec.begin();
         it != struct_def.fields.vec.end(); ++it) {
      const FieldDef &field = **it;
      if (field.value.type.base_type == BASE_TYPE_STRUCT) {
        StructPackArgs(*field.value.type.struct_def,
                       (nameprefix + namer_.Field(field) + ".").c_str(),
                       code_ptr);
      } else {
        code += std::string(", t.") + nameprefix + namer_.Field(field);
      }
    }
  }